

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

int __thiscall SocketInternals::FlushRecv(SocketInternals *this)

{
  int iVar1;
  int local_2c;
  uchar local_28 [4];
  int numFlushed;
  uchar buffer [20];
  SocketInternals *this_local;
  
  local_2c = 0;
  unique0x10000035 = this;
  while( true ) {
    iVar1 = Recv(this,local_28,0x14,0.0);
    if (iVar1 < 1) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int SocketInternals::FlushRecv(void)
{
    unsigned char buffer[FW_QRESPONSE_SIZE];
    int numFlushed = 0;
    // If the packet is larger than FW_QRESPONSE_SIZE, the excess bytes will be discarded.
    while (Recv(buffer, FW_QRESPONSE_SIZE, 0.0) > 0)
        numFlushed++;
    return numFlushed;
}